

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osmutex.cpp
# Opt level: O0

CK_RV OSLockMutex(CK_VOID_PTR mutex)

{
  int iVar1;
  pthread_mutex_t *in_RDI;
  pthread_mutex_t *pthreadMutex;
  int rv;
  CK_RV local_8;
  
  if (in_RDI == (pthread_mutex_t *)0x0) {
    softHSMLog(3,"OSLockMutex",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/osmutex.cpp"
               ,0x68,"Cannot lock NULL mutex");
    local_8 = 7;
  }
  else {
    iVar1 = pthread_mutex_lock(in_RDI);
    if (iVar1 == 0) {
      local_8 = 0;
    }
    else {
      softHSMLog(3,"OSLockMutex",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/common/osmutex.cpp"
                 ,0x6f,"Failed to lock POSIX mutex 0x%08X (0x%08X)",in_RDI,iVar1);
      local_8 = 5;
    }
  }
  return local_8;
}

Assistant:

CK_RV OSLockMutex(CK_VOID_PTR mutex)
{
	int rv;
	pthread_mutex_t* pthreadMutex = (pthread_mutex_t*) mutex;

	if (pthreadMutex == NULL)
	{
		ERROR_MSG("Cannot lock NULL mutex");

		return CKR_ARGUMENTS_BAD;
	}

	if ((rv = pthread_mutex_lock(pthreadMutex)) != 0)
	{
		ERROR_MSG("Failed to lock POSIX mutex 0x%08X (0x%08X)", pthreadMutex, rv);

		return CKR_GENERAL_ERROR;
	}

	return CKR_OK;
}